

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * getgeneric(Table *t,TValue *key)

{
  int iVar1;
  Node *pNVar2;
  long lVar3;
  
  pNVar2 = mainposition(t,key);
  do {
    iVar1 = luaV_equalobj((lua_State *)0x0,&(pNVar2->i_key).tvk,key);
    if (iVar1 != 0) {
      return &pNVar2->i_val;
    }
    lVar3 = (long)(pNVar2->i_key).nk.next;
    pNVar2 = pNVar2 + lVar3;
  } while (lVar3 != 0);
  return &luaO_nilobject_;
}

Assistant:

static const TValue *getgeneric (Table *t, const TValue *key) {
  Node *n = mainposition(t, key);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (luaV_rawequalobj(gkey(n), key))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return luaO_nilobject;  /* not found */
      n += nx;
    }
  }
}